

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O3

void Open_Display(DspInterface dsp)

{
  if (!Lisp_Xinitialized) {
    XSynchronize(dsp->display_id,xsync);
    Colors = *(Colormap *)
              (*(long *)(dsp->display_id + 0xe8) + 0x50 +
              (long)*(int *)(dsp->display_id + 0xe0) * 0x80);
    if ((dsp->ScreenBitmap).data == (char *)0x0) {
      (dsp->ScreenBitmap).data = (char *)DisplayRegion68k;
    }
    Create_LispWindow(dsp);
    Lisp_Xinitialized = true;
    init_Xevent(dsp);
    return;
  }
  __assert_fail("Lisp_Xinitialized == false",
                "/workspace/llm4binary/github/license_c_cmakelists/Interlisp[P]maiko/src/xinit.c",
                0xb4,"void Open_Display(DspInterface)");
}

Assistant:

void Open_Display(DspInterface dsp)
{
  assert(Lisp_Xinitialized == false);

  /****************************************************/
  /* If debugging, set the X connection so that	*/
  /* we run synchronized--so a debugger can		*/
  /* 'stop in _XError' and know EXACTLY where		*/
  /* an error got caused.				*/
  /****************************************************/
  XSynchronize(dsp->display_id, xsync);

  Colors =
      DefaultColormapOfScreen(ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id)));

  /* When we make the initial screen we haven't yet read in the */
  /* displayregion bitmap. Fix this now. */
  if (dsp->ScreenBitmap.data == NULL) dsp->ScreenBitmap.data = (char *)DisplayRegion68k;

  Create_LispWindow(dsp); /* Make the main window */
  Lisp_Xinitialized = true;
  init_Xevent(dsp); /* Turn on the event reporting */
}